

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

int Sfm_LibFindAreaMatch(Sfm_Lib_t *p,word *pTruth,int nFanins,int *piObj)

{
  int iVar1;
  int *piVar2;
  Sfm_Fun_t *pSVar3;
  
  piVar2 = Vec_MemHashLookup(p->vTtMem,pTruth);
  if (*piVar2 == -1) {
    iVar1 = -1;
  }
  else {
    iVar1 = Vec_IntEntry(&p->vLists,*piVar2);
    if (iVar1 == -1) {
      pSVar3 = (Sfm_Fun_t *)0x0;
    }
    else {
      pSVar3 = p->pObjs + iVar1;
    }
    if (piObj != (int *)0x0) {
      *piObj = (int)(((long)pSVar3 - (long)p->pObjs) / 0x1c);
    }
    iVar1 = pSVar3->Area;
  }
  return iVar1;
}

Assistant:

int Sfm_LibFindAreaMatch( Sfm_Lib_t * p, word * pTruth, int nFanins, int * piObj )
{
    Sfm_Fun_t * pObj = NULL;
    int iFunc = *Vec_MemHashLookup( p->vTtMem,  pTruth );
    if ( iFunc == -1 )
        return -1;
    Sfm_LibForEachSuper( p, pObj, iFunc )
        break;
    if ( piObj )
        *piObj = pObj - p->pObjs;
    return pObj->Area;
}